

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O3

bool miniros::xml_cast<bool>(RpcValue *xml_value)

{
  Type TVar1;
  byte bVar2;
  
  TVar1 = xml_value->_type;
  if (TVar1 == TypeBoolean) {
    XmlRpc::XmlRpcValue::assertTypeOrInvalid(xml_value,TypeBoolean);
    bVar2 = (xml_value->_value).asBool;
  }
  else if (TVar1 == TypeInt) {
    XmlRpc::XmlRpcValue::assertTypeOrInvalid(xml_value,TypeInt);
    bVar2 = (xml_value->_value).asInt != 0;
  }
  else if (TVar1 == TypeDouble) {
    XmlRpc::XmlRpcValue::assertTypeOrInvalid(xml_value,TypeDouble);
    bVar2 = -((xml_value->_value).asDouble != 0.0) & 1;
  }
  else {
    bVar2 = 0;
  }
  return (bool)bVar2;
}

Assistant:

bool xml_cast(MasterLink::RpcValue xml_value)
{
  using namespace XmlRpc;
  switch (xml_value.getType()) {
    case XmlRpcValue::TypeDouble:
      return static_cast<bool>(static_cast<double>(xml_value));
    case XmlRpcValue::TypeInt:
      return static_cast<bool>(static_cast<int>(xml_value));
    case XmlRpcValue::TypeBoolean:
      return static_cast<bool>(xml_value);
    default:
      return false;
  };
}